

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O1

void __thiscall Clasp::CBConsequences::CBFinder::pushLocked(CBFinder *this,Solver *s,ClauseHead *c)

{
  Constraint *pCVar1;
  int iVar2;
  size_type sVar3;
  ClauseHead *local_30;
  
  sVar3 = (this->locked).ebo_.size;
  while (sVar3 != 0) {
    pCVar1 = (this->locked).ebo_.buf[sVar3 - 1];
    iVar2 = (*pCVar1->_vptr_Constraint[0xb])(pCVar1,s);
    if ((char)iVar2 != '\0') break;
    (*pCVar1->_vptr_Constraint[5])(pCVar1,s,1);
    sVar3 = (this->locked).ebo_.size - 1;
    (this->locked).ebo_.size = sVar3;
  }
  local_30 = c;
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
            (&this->locked,(Constraint **)&local_30);
  return;
}

Assistant:

void CBConsequences::CBFinder::pushLocked(Solver& s, ClauseHead* c) {
	for (ClauseHead* h; !locked.empty() && !(h = static_cast<ClauseHead*>(locked.back()))->locked(s);) {
		h->destroy(&s, true);
		locked.pop_back();
	}
	locked.push_back(c);
}